

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::OwnedFileDescriptor::OwnedFileDescriptor
          (OwnedFileDescriptor *this,int fd,uint flags)

{
  bool bVar1;
  Fault local_58;
  Fault f_1;
  int local_48;
  DebugExpression<int> local_44;
  DebugExpression<int> local_40 [2];
  DebugExpression<int> _kjCondition_1;
  Fault local_30;
  Fault f;
  DebugExpression<int> local_20;
  DebugExpression<int> local_1c;
  uint local_18;
  DebugExpression<int> _kjCondition;
  uint flags_local;
  int fd_local;
  OwnedFileDescriptor *this_local;
  
  this->fd = fd;
  this->flags = flags;
  local_18 = flags;
  _kjCondition.value = fd;
  if ((flags & 4) == 0) {
    setNonblocking(fd);
  }
  else {
    f.exception._4_4_ = fcntl64(fd,3);
    local_20 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (int *)((long)&f.exception + 4));
    f.exception._0_4_ = 0x800;
    local_1c = kj::_::DebugExpression<int>::operator&(&local_20,(int *)&f);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1c);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<int>&,char_const(&)[46]>
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x73,FAILED,"fcntl(fd, F_GETFL) & O_NONBLOCK",
                 "_kjCondition,\"You claimed you set NONBLOCK, but you didn\'t.\"",&local_1c,
                 (char (*) [46])"You claimed you set NONBLOCK, but you didn\'t.");
      kj::_::Debug::Fault::fatal(&local_30);
    }
  }
  if ((local_18 & 1) != 0) {
    if ((local_18 & 2) == 0) {
      setCloseOnExec(_kjCondition.value);
    }
    else {
      local_48 = fcntl64(_kjCondition.value,1);
      local_44 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
      f_1.exception._4_4_ = 1;
      local_40[0] = kj::_::DebugExpression<int>::operator&
                              (&local_44,(int *)((long)&f_1.exception + 4));
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_40);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<int>&,char_const(&)[45]>
                  (&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x7b,FAILED,"fcntl(fd, F_GETFD) & FD_CLOEXEC",
                   "_kjCondition,\"You claimed you set CLOEXEC, but you didn\'t.\"",local_40,
                   (char (*) [45])"You claimed you set CLOEXEC, but you didn\'t.");
        kj::_::Debug::Fault::fatal(&local_58);
      }
    }
  }
  return;
}

Assistant:

OwnedFileDescriptor(int fd, uint flags): fd(fd), flags(flags) {
    if (flags & LowLevelAsyncIoProvider::ALREADY_NONBLOCK) {
      KJ_DREQUIRE(fcntl(fd, F_GETFL) & O_NONBLOCK, "You claimed you set NONBLOCK, but you didn't.");
    } else {
      setNonblocking(fd);
    }

    if (flags & LowLevelAsyncIoProvider::TAKE_OWNERSHIP) {
      if (flags & LowLevelAsyncIoProvider::ALREADY_CLOEXEC) {
        KJ_DREQUIRE(fcntl(fd, F_GETFD) & FD_CLOEXEC,
                    "You claimed you set CLOEXEC, but you didn't.");
      } else {
        setCloseOnExec(fd);
      }
    }
  }